

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O1

void directed_flag_complex_computer::prepare_graph_filtration<directed_flag_complex_t>
               (directed_flag_complex_t *complex,filtered_directed_graph_t *graph,
               filtration_algorithm_t *filtration_algorithm,size_t nb_threads)

{
  pointer pfVar1;
  iterator __position;
  _Hash_node_base *p_Var2;
  pointer puVar3;
  unsigned_short *puVar4;
  float *pfVar5;
  _Hash_node_base *p_Var6;
  ushort uVar7;
  int iVar8;
  ostream *poVar9;
  byte bVar10;
  filtered_directed_graph_t *pfVar11;
  filtered_directed_graph_t *pfVar12;
  long lVar13;
  unsigned_short *puVar14;
  float *pfVar15;
  size_t sVar16;
  vector<float,_std::allocator<float>_> *pvVar17;
  long lVar18;
  bool bVar19;
  float extraout_XMM0_Da;
  vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  reorder_filtration;
  directed_flag_complex_cell_t cell;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  new_edges;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> hash;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  new_filtrations;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> empty;
  vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  local_168;
  filtered_directed_graph_t *local_148;
  filtered_directed_graph_t *pfStack_140;
  vector<float,_std::allocator<float>_> *local_138;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvStack_130;
  vector<float,_std::allocator<float>_> *local_128;
  pointer local_120;
  pointer pfStack_118;
  pointer local_110;
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  *local_108;
  size_t local_100;
  size_t *local_f8;
  filtration_algorithm_t *local_f0;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_e8;
  directed_flag_complex_t *local_d0;
  undefined1 local_c8 [40];
  float local_a0;
  pointer local_98;
  __node_base_ptr p_Stack_90;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_88;
  undefined1 local_70 [64];
  
  if (filtration_algorithm == (filtration_algorithm_t *)0x0) {
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_148,
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)local_c8,
               (allocator_type *)local_70);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&graph->vertex_filtration,(vector<float,_std::allocator<float>_> *)&local_148);
    if (local_148 != (filtered_directed_graph_t *)0x0) {
      operator_delete(local_148,(long)local_138 - (long)local_148);
    }
  }
  else {
    iVar8 = (*filtration_algorithm->_vptr_filtration_algorithm_t[3])(filtration_algorithm);
    if ((char)iVar8 != '\0') {
      local_148 = (filtered_directed_graph_t *)&PTR_vertex_0014f288;
      pfStack_140 = (filtered_directed_graph_t *)0x0;
      local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffff0000;
      if ((graph->super_directed_graph_t).number_of_vertices != 0) {
        do {
          pfStack_140 = (filtered_directed_graph_t *)local_c8;
          (*filtration_algorithm->_vptr_filtration_algorithm_t[2])
                    (filtration_algorithm,0,&local_148,graph);
          (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_c8._0_8_ & 0xffff] = extraout_XMM0_Da;
          uVar7 = local_c8._0_2_ + 1;
          local_c8._0_2_ = uVar7;
        } while (uVar7 < (graph->super_directed_graph_t).number_of_vertices);
      }
    }
  }
  local_f0 = filtration_algorithm;
  local_d0 = complex;
  if ((filtration_algorithm == (filtration_algorithm_t *)0x0) ||
     (((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start &&
      (iVar8 = (*filtration_algorithm->_vptr_filtration_algorithm_t[4])(filtration_algorithm),
      (char)iVar8 == '\0')))) {
    bVar10 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"computing the filtration of all edges",0x25);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\r",1);
    local_108 = (vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                 *)local_c8;
    local_c8._16_8_ = (pointer)0x0;
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (pointer)0x0;
    local_128 = &graph->vertex_filtration;
    local_148 = (filtered_directed_graph_t *)CONCAT44(local_148._4_4_,0xffffffff);
    local_138 = (vector<float,_std::allocator<float>_> *)0x0;
    local_120 = (pointer)0x0;
    pfStack_118 = (pointer)0x0;
    local_110 = (pointer)0x0;
    local_f8 = (size_t *)0x0;
    pfStack_140 = graph;
    pvStack_130 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)filtration_algorithm;
    local_100 = nb_threads;
    std::
    vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
    ::vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
              *)local_70,nb_threads,(value_type *)&local_148,(allocator_type *)&local_e8);
    if (local_120 != (pointer)0x0) {
      operator_delete(local_120,(long)local_110 - (long)local_120);
    }
    directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::compute_filtration_t>
              (complex,(vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                        *)local_70,1,-1);
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    std::vector<float,_std::allocator<float>_>::reserve
              (&graph->edge_filtration,
               (ulong)((long)(graph->super_directed_graph_t).edges.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(graph->super_directed_graph_t).edges.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 1) >> 1);
    if (nb_threads != 0) {
      sVar16 = 0;
      do {
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_148,
                   (vector<float,_std::allocator<float>_> *)
                   (CONCAT71(local_70._1_7_,local_70[0]) + sVar16 * 0x58 + 0x28));
        pfVar12 = pfStack_140;
        for (pfVar11 = local_148; pfVar11 != pfVar12;
            pfVar11 = (filtered_directed_graph_t *)&(pfVar11->super_directed_graph_t).field_0x4) {
          local_e8.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ =
               *(float *)&pfVar11->super_directed_graph_t;
          __position._M_current =
               (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&graph->edge_filtration,__position,
                       (float *)&local_e8);
          }
          else {
            *__position._M_current =
                 local_e8.
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
            (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        if (local_148 != (filtered_directed_graph_t *)0x0) {
          operator_delete(local_148,(long)local_138 - (long)local_148);
        }
        sVar16 = sVar16 + 1;
      } while (sVar16 != nb_threads);
    }
    std::
    vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
    ::~vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
               *)local_70);
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
               *)local_c8);
    bVar10 = 1;
    filtration_algorithm = local_f0;
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&local_e8,nb_threads,(allocator_type *)&local_148);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_88,nb_threads,(allocator_type *)&local_148);
  local_c8._8_8_ = &p_Stack_90;
  local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
  local_c8._16_8_ = (pointer)0x1;
  local_c8._24_8_ = (_Hash_node_base *)0x0;
  local_c8._32_8_ = (pointer)0x0;
  local_a0 = 1.0;
  local_98 = (pointer)0x0;
  p_Stack_90 = (__node_base_ptr)0x0;
  if ((filtration_algorithm != (filtration_algorithm_t *)0x0) &&
     (cell_hasher_t::dimension = 1,
     2 < (ulong)((long)(graph->super_directed_graph_t).edges.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(graph->super_directed_graph_t).edges.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start))) {
    pfVar12 = (filtered_directed_graph_t *)
              (graph->super_directed_graph_t).edges.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar17 = (vector<float,_std::allocator<float>_> *)0x0;
    do {
      local_148 = (filtered_directed_graph_t *)&PTR_vertex_0014f288;
      pfStack_140 = pfVar12;
      local_138 = pvVar17;
      std::
      _Hashtable<directed_flag_complex_cell_t,std::pair<directed_flag_complex_cell_t_const,unsigned_long>,std::allocator<std::pair<directed_flag_complex_cell_t_const,unsigned_long>>,std::__detail::_Select1st,cell_comparer_t,cell_hasher_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<directed_flag_complex_cell_t,unsigned_long>>
                ((_Hashtable<directed_flag_complex_cell_t,std::pair<directed_flag_complex_cell_t_const,unsigned_long>,std::allocator<std::pair<directed_flag_complex_cell_t_const,unsigned_long>>,std::__detail::_Select1st,cell_comparer_t,cell_hasher_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_c8,&local_148);
      pvVar17 = (vector<float,_std::allocator<float>_> *)
                ((long)&(pvVar17->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
      pfVar12 = (filtered_directed_graph_t *)&(pfVar12->super_directed_graph_t).field_0x4;
    } while (pvVar17 < (vector<float,_std::allocator<float>_> *)
                       ((ulong)((long)(graph->super_directed_graph_t).edges.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(graph->super_directed_graph_t).edges.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 1) >> 1));
  }
  local_168.
  super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (reorder_edges_t *)0x0;
  local_168.
  super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (reorder_edges_t *)0x0;
  if (nb_threads != 0) {
    bVar19 = local_f0 != (filtration_algorithm_t *)0x0;
    pvVar17 = &graph->edge_filtration;
    lVar18 = 0;
    sVar16 = nb_threads;
    do {
      pvStack_130 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    (CONCAT44(local_e8.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_e8.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar18);
      local_138 = (vector<float,_std::allocator<float>_> *)
                  ((long)&((local_88.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar18);
      local_128 = (vector<float,_std::allocator<float>_> *)
                  CONCAT71(local_128._1_7_,(bVar10 ^ 1) & bVar19);
      local_148 = (filtered_directed_graph_t *)local_c8;
      pfStack_140 = (filtered_directed_graph_t *)pvVar17;
      if (local_168.
          super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_168.
          super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
        ::_M_realloc_insert<directed_flag_complex_computer::reorder_edges_t>
                  (&local_168,
                   (iterator)
                   local_168.
                   super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(reorder_edges_t *)&local_148);
      }
      else {
        *(vector<float,_std::allocator<float>_> **)
         &(local_168.
           super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
           ._M_impl.super__Vector_impl_data._M_finish)->reorder_filtration = local_128;
        (local_168.
         super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
         ._M_impl.super__Vector_impl_data._M_finish)->new_filtration = local_138;
        (local_168.
         super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
         ._M_impl.super__Vector_impl_data._M_finish)->new_edges = pvStack_130;
        (local_168.
         super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
         ._M_impl.super__Vector_impl_data._M_finish)->cell_hash =
             (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
              *)local_c8;
        (local_168.
         super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
         ._M_impl.super__Vector_impl_data._M_finish)->old_filtration = pvVar17;
        local_168.
        super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_168.
             super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar18 = lVar18 + 0x18;
      sVar16 = sVar16 - 1;
    } while (sVar16 != 0);
  }
  directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::reorder_edges_t>
            (local_d0,&local_168,1,-1);
  p_Var6 = (_Hash_node_base *)local_c8._24_8_;
  while (p_Var6 != (_Hash_node_base *)0x0) {
    p_Var2 = p_Var6->_M_nxt;
    operator_delete(p_Var6,0x28);
    p_Var6 = p_Var2;
  }
  memset((void *)local_c8._8_8_,0,local_c8._16_8_ << 3);
  local_c8._24_8_ = (_Hash_node_base *)0x0;
  local_c8._32_8_ = (pointer)0x0;
  local_70._8_8_ = local_70 + 0x38;
  local_70[0] = (allocator_type)0x0;
  local_70._16_8_ = (pointer)0x1;
  local_70._24_8_ = (__node_base_ptr)0x0;
  local_70._32_8_ = (pointer)0x0;
  local_70._40_4_ = 1.0;
  local_70._48_8_ = (pointer)0x0;
  local_70._56_8_ = (__node_base_ptr)0x0;
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&local_148,
               (_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_c8,
               (_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_c8);
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_c8,local_70);
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_70,&local_148);
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_148);
  if (nb_threads != 0) {
    puVar3 = (graph->super_directed_graph_t).edges.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar16 = 0;
    lVar18 = 0;
    lVar13 = 0;
    do {
      if (bVar10 == 0) {
        pfVar5 = local_88.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar16].
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (pfVar15 = local_88.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar16].
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start; pfVar15 != pfVar5; pfVar15 = pfVar15 + 1) {
          pfVar1[lVar13] = *pfVar15;
          lVar13 = lVar13 + 1;
        }
      }
      puVar4 = *(unsigned_short **)
                (CONCAT44(local_e8.
                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          local_e8.
                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8 + sVar16 * 0x18);
      for (puVar14 = *(unsigned_short **)
                      (CONCAT44(local_e8.
                                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_e8.
                                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_) + sVar16 * 0x18);
          puVar14 != puVar4; puVar14 = puVar14 + 1) {
        puVar3[lVar18] = *puVar14;
        lVar18 = lVar18 + 1;
      }
      sVar16 = sVar16 + 1;
    } while (sVar16 != nb_threads);
  }
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_70);
  if (local_168.
      super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_c8);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

void prepare_graph_filtration(Complex& complex, filtered_directed_graph_t& graph,
                              filtration_algorithm_t* filtration_algorithm, const size_t nb_threads) {
	if (filtration_algorithm == nullptr) {
		// All vertices get the trivial filtration value
		graph.vertex_filtration = std::vector<value_t>(graph.vertex_filtration.size(), 0);
	} else {
		if (filtration_algorithm->overwrite_vertex_filtration()) {
			directed_flag_complex_cell_t cell;
			for (vertex_index_t v = 0; v < graph.number_of_vertices; v++) {
				cell.set_vertices(&v);
				graph.vertex_filtration[v] = filtration_algorithm->compute_filtration(0, cell, graph, nullptr);
			}
		}
	}

	bool computed_edge_filtration = false;
	if (filtration_algorithm != nullptr &&
	    (graph.edge_filtration.size() == 0 || filtration_algorithm->overwrite_edge_filtration())) {
		computed_edge_filtration = true;
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing the filtration of all edges" << std::flush << "\r";
#endif

		// Dummy parameter because we pass by reference the argument and
		// It cannot take a default value
		std::vector<cell_hash_map_t> tmp(0);
		std::vector<compute_filtration_t> compute_filtration(
		    nb_threads, compute_filtration_t(filtration_algorithm, graph, graph.vertex_filtration, tmp, nb_threads));
		complex.for_each_cell(compute_filtration, 1);
		graph.edge_filtration.clear();
		graph.edge_filtration.reserve(graph.edge_number());
		for (size_t i = 0; i < nb_threads; i++) {
			for (auto f : compute_filtration[i].filtration()) graph.edge_filtration.push_back(f);
		}
	}

	// Now, we reorder the edges and their filtration value such that it matches
	// the iteration order of "for_each_cell"
	std::vector<std::vector<vertex_index_t>> new_edges(nb_threads);
	std::vector<std::vector<value_t>> new_filtrations(nb_threads);

	hash_map<directed_flag_complex_cell_t, size_t, cell_hasher_t, cell_comparer_t> hash;
	if (filtration_algorithm != nullptr) {
		cell_hasher_t::set_current_cell_dimension(1);
		vertex_index_t* e = &(graph.edges[0]);
		directed_flag_complex_cell_t c;
		for (size_t i = 0; i < graph.edges.size() / 2; ++i, e += 2) {
			c.set_vertices(e);
			hash.insert(std::make_pair(c, i));
		}
	}

	std::vector<reorder_edges_t> reorder_filtration;
	for (size_t i = 0; i < nb_threads; i++) {
		reorder_filtration.push_back(reorder_edges_t(new_edges[i],
		                                             !computed_edge_filtration && filtration_algorithm != nullptr, hash,
		                                             graph.edge_filtration, new_filtrations[i]));
	}
	complex.for_each_cell(reorder_filtration, 1);

	hash.clear();
	hash_map<directed_flag_complex_cell_t, size_t, cell_hasher_t, cell_comparer_t> empty;
	std::swap(hash, empty);

	size_t current_filtration_index = 0;
	size_t current_edge_index = 0;
	for (size_t i = 0; i < nb_threads; i++) {
		if (!computed_edge_filtration)
			for (auto f : new_filtrations[i]) graph.edge_filtration[current_filtration_index++] = f;
		for (auto e : new_edges[i]) graph.edges[current_edge_index++] = e;
	}
}